

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::BeginDragDropSource(ImGuiDragDropFlags flags)

{
  ImGuiItemStatusFlags *pIVar1;
  ImRect *r_abs;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImGuiID id;
  uint *puVar5;
  ImGuiID IVar6;
  ImGuiWindow *this;
  
  pIVar3 = GImGui;
  if ((flags & 0x10U) == 0) {
    this = GImGui->CurrentWindow;
    id = (this->DC).LastItemId;
    if (id == 0) {
      if ((GImGui->IO).MouseDown[0] != false) {
        if ((flags & 8U) == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                        ,0x23db,"bool ImGui::BeginDragDropSource(ImGuiDragDropFlags)");
        }
        if ((((this->DC).LastItemStatusFlags & 1) != 0) ||
           ((GImGui->ActiveId != 0 && (GImGui->ActiveIdWindow == this)))) {
          r_abs = &(this->DC).LastItemRect;
          id = ImGuiWindow::GetIDFromRectangle(this,r_abs);
          (this->DC).LastItemId = id;
          bVar4 = ItemHoverable(r_abs,id);
          if ((bVar4) && ((pIVar3->IO).MouseClicked[0] == true)) {
            SetActiveID(id,this);
            FocusWindow(this);
          }
          if (pIVar3->ActiveId == id) goto LAB_00144d27;
        }
      }
    }
    else if (GImGui->ActiveId == id) {
      bVar4 = false;
      if ((GImGui->IO).MouseDown[0] == false) {
        return false;
      }
LAB_00144d27:
      pIVar3->ActiveIdAllowOverlap = bVar4;
      puVar5 = ImVector<unsigned_int>::back(&this->IDStack);
      IVar6 = *puVar5;
      bVar4 = IsMouseDragging(0,-1.0);
      pIVar3->ActiveIdUsingNavDirMask = 0xffffffff;
      pIVar3->ActiveIdUsingNavInputMask = 0xffffffff;
      pIVar3->ActiveIdUsingKeyInputMask = 0xffffffffffffffff;
      if (!bVar4) {
        return false;
      }
      goto LAB_00144be8;
    }
    bVar4 = false;
  }
  else {
    this = (ImGuiWindow *)0x0;
    id = ImHashStr("#SourceExtern",0,0);
    IVar6 = 0;
LAB_00144be8:
    if (pIVar3->DragDropActive == false) {
      if (id == 0) {
        __assert_fail("source_id != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                      ,0x240a,"bool ImGui::BeginDragDropSource(ImGuiDragDropFlags)");
      }
      ClearDragDrop();
      (pIVar3->DragDropPayload).SourceId = id;
      (pIVar3->DragDropPayload).SourceParentId = IVar6;
      pIVar3->DragDropActive = true;
      pIVar3->DragDropSourceFlags = flags;
      pIVar3->DragDropMouseButton = 0;
    }
    pIVar3->DragDropSourceFrameCount = pIVar3->FrameCount;
    pIVar3->DragDropWithinSource = true;
    if ((((flags & 1U) == 0) && (BeginTooltip(), pIVar3->DragDropAcceptIdPrev != 0)) &&
       ((pIVar3->DragDropAcceptFlags & 0x1000) != 0)) {
      pIVar2 = pIVar3->CurrentWindow;
      pIVar2->SkipItems = true;
      pIVar2->HiddenFramesCanSkipItems = 1;
    }
    bVar4 = true;
    if ((flags & 0x12U) == 0) {
      pIVar1 = &(this->DC).LastItemStatusFlags;
      *(byte *)pIVar1 = (byte)*pIVar1 & 0xfe;
    }
  }
  return bVar4;
}

Assistant:

bool ImGui::BeginDragDropSource(ImGuiDragDropFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    bool source_drag_active = false;
    ImGuiID source_id = 0;
    ImGuiID source_parent_id = 0;
    ImGuiMouseButton mouse_button = ImGuiMouseButton_Left;
    if (!(flags & ImGuiDragDropFlags_SourceExtern))
    {
        source_id = window->DC.LastItemId;
        if (source_id != 0 && g.ActiveId != source_id) // Early out for most common case
            return false;
        if (g.IO.MouseDown[mouse_button] == false)
            return false;

        if (source_id == 0)
        {
            // If you want to use BeginDragDropSource() on an item with no unique identifier for interaction, such as Text() or Image(), you need to:
            // A) Read the explanation below, B) Use the ImGuiDragDropFlags_SourceAllowNullID flag, C) Swallow your programmer pride.
            if (!(flags & ImGuiDragDropFlags_SourceAllowNullID))
            {
                IM_ASSERT(0);
                return false;
            }

            // Early out
            if ((window->DC.LastItemStatusFlags & ImGuiItemStatusFlags_HoveredRect) == 0 && (g.ActiveId == 0 || g.ActiveIdWindow != window))
                return false;

            // Magic fallback (=somehow reprehensible) to handle items with no assigned ID, e.g. Text(), Image()
            // We build a throwaway ID based on current ID stack + relative AABB of items in window.
            // THE IDENTIFIER WON'T SURVIVE ANY REPOSITIONING OF THE WIDGET, so if your widget moves your dragging operation will be canceled.
            // We don't need to maintain/call ClearActiveID() as releasing the button will early out this function and trigger !ActiveIdIsAlive.
            source_id = window->DC.LastItemId = window->GetIDFromRectangle(window->DC.LastItemRect);
            bool is_hovered = ItemHoverable(window->DC.LastItemRect, source_id);
            if (is_hovered && g.IO.MouseClicked[mouse_button])
            {
                SetActiveID(source_id, window);
                FocusWindow(window);
            }
            if (g.ActiveId == source_id) // Allow the underlying widget to display/return hovered during the mouse release frame, else we would get a flicker.
                g.ActiveIdAllowOverlap = is_hovered;
        }
        else
        {
            g.ActiveIdAllowOverlap = false;
        }
        if (g.ActiveId != source_id)
            return false;
        source_parent_id = window->IDStack.back();
        source_drag_active = IsMouseDragging(mouse_button);

        // Disable navigation and key inputs while dragging
        g.ActiveIdUsingNavDirMask = ~(ImU32)0;
        g.ActiveIdUsingNavInputMask = ~(ImU32)0;
        g.ActiveIdUsingKeyInputMask = ~(ImU64)0;
    }
    else
    {
        window = NULL;
        source_id = ImHashStr("#SourceExtern");
        source_drag_active = true;
    }

    if (source_drag_active)
    {
        if (!g.DragDropActive)
        {
            IM_ASSERT(source_id != 0);
            ClearDragDrop();
            ImGuiPayload& payload = g.DragDropPayload;
            payload.SourceId = source_id;
            payload.SourceParentId = source_parent_id;
            g.DragDropActive = true;
            g.DragDropSourceFlags = flags;
            g.DragDropMouseButton = mouse_button;
        }
        g.DragDropSourceFrameCount = g.FrameCount;
        g.DragDropWithinSource = true;

        if (!(flags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
        {
            // Target can request the Source to not display its tooltip (we use a dedicated flag to make this request explicit)
            // We unfortunately can't just modify the source flags and skip the call to BeginTooltip, as caller may be emitting contents.
            BeginTooltip();
            if (g.DragDropAcceptIdPrev && (g.DragDropAcceptFlags & ImGuiDragDropFlags_AcceptNoPreviewTooltip))
            {
                ImGuiWindow* tooltip_window = g.CurrentWindow;
                tooltip_window->SkipItems = true;
                tooltip_window->HiddenFramesCanSkipItems = 1;
            }
        }

        if (!(flags & ImGuiDragDropFlags_SourceNoDisableHover) && !(flags & ImGuiDragDropFlags_SourceExtern))
            window->DC.LastItemStatusFlags &= ~ImGuiItemStatusFlags_HoveredRect;

        return true;
    }
    return false;
}